

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshParameters::Read(ON_MeshParameters *this,ON_BinaryArchive *file)

{
  uint uVar1;
  undefined1 local_88 [8];
  ON_SubDDisplayParameters subdp;
  uint local_40;
  uint uStack_3c;
  uchar mesher;
  uint texture_range;
  uint face_type;
  double obsolete_m_combine_angle;
  uint local_28;
  int obsolete_m_bWeld;
  int i;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_MeshParameters *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  memcpy(this,&DefaultMesh,0xe0);
  *(undefined8 *)(this->m_geometry_settings_hash).m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_
  ;
  *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) =
       ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  iStack_1c = 0;
  i = 0;
  obsolete_m_bWeld._3_1_ =
       ON_BinaryArchive::Read3dmChunkVersion(_minor_version,&stack0xffffffffffffffe4,&i);
  if (((bool)obsolete_m_bWeld._3_1_) && (iStack_1c == 1)) {
    local_28 = (uint)(this->m_bComputeCurvature & 1);
    if ((bool)obsolete_m_bWeld._3_1_) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&local_28);
    }
    this->m_bComputeCurvature = (bool)(-(local_28 != 0) & 1);
    local_28 = (uint)(this->m_bSimplePlanes & 1);
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&local_28);
    }
    this->m_bSimplePlanes = (bool)(-(local_28 != 0) & 1);
    local_28 = (uint)(this->m_bRefine & 1);
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&local_28);
    }
    this->m_bRefine = (bool)(-(local_28 != 0) & 1);
    local_28 = (uint)(this->m_bJaggedSeams & 1);
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&local_28);
    }
    this->m_bJaggedSeams = (bool)(-(local_28 != 0) & 1);
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ =
           ON_BinaryArchive::ReadInt
                     (_minor_version,(ON__INT32 *)((long)&obsolete_m_combine_angle + 4));
    }
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_tolerance);
    }
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_min_edge_length)
      ;
    }
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_max_edge_length)
      ;
    }
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ =
           ON_BinaryArchive::ReadDouble(_minor_version,&this->m_grid_aspect_ratio);
    }
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&this->m_grid_min_count);
    }
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&this->m_grid_max_count);
    }
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ =
           ON_BinaryArchive::ReadDouble(_minor_version,&this->m_grid_angle_radians);
    }
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ =
           ON_BinaryArchive::ReadDouble(_minor_version,&this->m_grid_amplification);
    }
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ =
           ON_BinaryArchive::ReadDouble(_minor_version,&this->m_refine_angle_radians);
    }
    if ((bool)obsolete_m_bWeld._3_1_ != false) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadDouble(_minor_version,(double *)&texture_range)
      ;
    }
    uStack_3c = FaceType(this);
    if ((obsolete_m_bWeld._3_1_ & 1) != 0) {
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&stack0xffffffffffffffc4);
    }
    if ((obsolete_m_bWeld._3_1_ & 1) != 0) {
      SetFaceType(this,uStack_3c);
    }
    if (((obsolete_m_bWeld._3_1_ & 1) != 0) && (0 < i)) {
      local_40 = TextureRange(this);
      obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&local_40);
      if ((bool)obsolete_m_bWeld._3_1_) {
        SetTextureRange(this,local_40);
      }
      if (((obsolete_m_bWeld._3_1_ & 1) != 0) && (1 < i)) {
        obsolete_m_bWeld._3_1_ = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bCustomSettings)
        ;
        if ((bool)obsolete_m_bWeld._3_1_) {
          obsolete_m_bWeld._3_1_ =
               ON_BinaryArchive::ReadDouble(_minor_version,&this->m_relative_tolerance);
        }
        if (((bool)obsolete_m_bWeld._3_1_ != false) && (2 < i)) {
          uVar1 = Mesher(this);
          subdp.m_progress_reporter_interval.m_t[1]._7_1_ = (byte)uVar1;
          obsolete_m_bWeld._3_1_ =
               ON_BinaryArchive::ReadChar
                         (_minor_version,
                          (ON__UINT8 *)((long)subdp.m_progress_reporter_interval.m_t + 0xf));
          if ((bool)obsolete_m_bWeld._3_1_) {
            SetMesher(this,(uint)subdp.m_progress_reporter_interval.m_t[1]._7_1_);
          }
          if (((((obsolete_m_bWeld._3_1_ & 1) != 0) && (3 < i)) &&
              (obsolete_m_bWeld._3_1_ =
                    ON_BinaryArchive::ReadBool(_minor_version,&this->m_bCustomSettingsEnabled),
              (bool)obsolete_m_bWeld._3_1_)) && (4 < i)) {
            memcpy(local_88,&ON_SubDDisplayParameters::Default,0x40);
            obsolete_m_bWeld._3_1_ =
                 ON_SubDDisplayParameters::Read((ON_SubDDisplayParameters *)local_88,_minor_version)
            ;
            if ((bool)obsolete_m_bWeld._3_1_) {
              SetSubDDisplayParameters(this,(ON_SubDDisplayParameters *)local_88);
              uVar1 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_minor_version);
              Internal_MeshParametersRead_UpdateSubDParameters(uVar1,this);
            }
          }
        }
      }
    }
  }
  return (bool)(obsolete_m_bWeld._3_1_ & 1);
}

Assistant:

bool ON_MeshParameters::Read( ON_BinaryArchive& file )
{
  *this = ON_MeshParameters::DefaultMesh;
  m_geometry_settings_hash = ON_SHA1_Hash::ZeroDigest;

  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 ) 
  {
    int i;

    i = m_bComputeCurvature;
    if (rc) rc = file.ReadInt(&i);
    m_bComputeCurvature = i?true:false;

    i = m_bSimplePlanes;
    if (rc) rc = file.ReadInt(&i);
    m_bSimplePlanes = i?true:false;

    i = m_bRefine;
    if (rc) rc = file.ReadInt(&i);
    m_bRefine = i?true:false;

    i = m_bJaggedSeams;
    if (rc) rc = file.ReadInt(&i);
    m_bJaggedSeams = i?true:false;

    int obsolete_m_bWeld;
    if (rc) rc = file.ReadInt(&obsolete_m_bWeld);

    if (rc) rc = file.ReadDouble(&m_tolerance);
    if (rc) rc = file.ReadDouble(&m_min_edge_length);
    if (rc) rc = file.ReadDouble(&m_max_edge_length);
    if (rc) rc = file.ReadDouble(&m_grid_aspect_ratio);
    if (rc) rc = file.ReadInt(&m_grid_min_count);
    if (rc) rc = file.ReadInt(&m_grid_max_count);
    if (rc) rc = file.ReadDouble(&m_grid_angle_radians);
    if (rc) rc = file.ReadDouble(&m_grid_amplification);
    if (rc) rc = file.ReadDouble(&m_refine_angle_radians);
    double obsolete_m_combine_angle;
    if (rc) rc = file.ReadDouble(&obsolete_m_combine_angle);
    unsigned int face_type = FaceType();
    if (rc) rc = file.ReadInt(&face_type);
    if (rc) 
      SetFaceType(face_type);

    if ( rc && minor_version >= 1 ) 
    {
      unsigned int texture_range = TextureRange();
      rc = file.ReadInt( &texture_range );
      if (rc)
        SetTextureRange(texture_range);
      if ( rc && minor_version >= 2 )
      {
        rc = file.ReadBool(&m_bCustomSettings);
        if (rc) rc = file.ReadDouble(&m_relative_tolerance);
        if ( rc && minor_version >= 3 )
        {
          unsigned char mesher = (unsigned char)Mesher();
          rc = file.ReadChar(&mesher);
          if (rc)
            SetMesher(mesher);
          if ( rc && minor_version >= 4 )
          {
            rc = file.ReadBool(&m_bCustomSettingsEnabled);
            if (rc && minor_version >= 5)
            {
              ON_SubDDisplayParameters subdp = ON_SubDDisplayParameters::Default;
              rc = subdp.Read(file);
              if (rc)
              {
                this->SetSubDDisplayParameters(subdp);
                Internal_MeshParametersRead_UpdateSubDParameters(file.ArchiveOpenNURBSVersion(), *this);
              }
            }
          }
        }
      }
    }
  }

  return rc;
}